

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::ConstScalarMultiply::dim_forward
          (ConstScalarMultiply *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  size_type sVar1;
  ostream *this_00;
  invalid_argument *this_01;
  const_reference __src;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  Dim *ds;
  ostream *in_stack_ffffffffffffffe0;
  
  ds = in_RDI;
  sVar1 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar1 != 1) {
    std::operator<<((ostream *)&std::cerr,"ConstScalarMultiply expects one argument: ");
    this_00 = cnn::operator<<(in_stack_ffffffffffffffe0,
                              (vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)ds);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"ConstScalarMultiply expects one argument");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __src = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  memcpy(in_RDI,__src,0x24);
  return ds;
}

Assistant:

Dim ConstScalarMultiply::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1) {
    cerr << "ConstScalarMultiply expects one argument: " << xs << endl;
    throw std::invalid_argument("ConstScalarMultiply expects one argument");
  }
  return xs[0];
}